

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

DualMap * __thiscall bloaty::DualMaps::AppendMap(DualMaps *this)

{
  DualMap *this_00;
  pointer pDVar1;
  DualMap **in_RDI;
  
  this_00 = (DualMap *)operator_new(0x60);
  DualMap::DualMap(this_00);
  std::
  vector<std::unique_ptr<bloaty::DualMap,std::default_delete<bloaty::DualMap>>,std::allocator<std::unique_ptr<bloaty::DualMap,std::default_delete<bloaty::DualMap>>>>
  ::emplace_back<bloaty::DualMap*>
            ((vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
              *)this_00,in_RDI);
  std::
  vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
  ::back((vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
          *)this_00);
  pDVar1 = std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>::get
                     ((unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_> *)this_00)
  ;
  return pDVar1;
}

Assistant:

DualMap* AppendMap() {
    maps_.emplace_back(new DualMap);
    return maps_.back().get();
  }